

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O2

QcSocket * qc_tcp_accept(QcSocket *socket)

{
  int iVar1;
  QcSocket *__ptr;
  int addr_len;
  sockaddr addr;
  
  if (socket == (QcSocket *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0xa9);
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0xa9,"QcSocket *qc_tcp_accept(QcSocket *)");
  }
  __ptr = (QcSocket *)malloc(4);
  if (__ptr != (QcSocket *)0x0) {
    addr_len = 0x10;
    iVar1 = accept(socket->sockfd,(sockaddr *)&addr,(socklen_t *)&addr_len);
    __ptr->sockfd = iVar1;
    if (iVar1 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0xb2,"socket accept failed");
      free(__ptr);
      __ptr = (QcSocket *)0x0;
    }
    return __ptr;
  }
  fprintf(_stderr,"malloc failed. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
          ,0xab);
  __assert_fail("new_sock",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                ,0xab,"QcSocket *qc_tcp_accept(QcSocket *)");
}

Assistant:

QcSocket* qc_tcp_accept(QcSocket *socket)
{
    QcSocket *new_sock;
    struct sockaddr addr;
    int addr_len;

    qc_assert(socket);

    qc_malloc(new_sock, sizeof(QcSocket));

    addr_len = sizeof(addr);

    new_sock->sockfd = (int)accept(socket->sockfd, &addr, (socklen_t*)&addr_len);
    if(new_sock->sockfd < 0)
    {
        qc_error("socket accept failed");
        qc_free(new_sock);
        return NULL;
    }

    return new_sock;
}